

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

int EnsureInitialized(BrotliEncoderState *s)

{
  int iVar1;
  byte bVar2;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int lgwin;
  BrotliEncoderState *s_local;
  int max_lgwin;
  int local_54;
  int lgblock;
  int tail_bits;
  int window_bits;
  
  if (s->is_initialized_ == 0) {
    local_90 = (s->params).quality;
    if (local_90 < 0) {
      local_90 = 0;
    }
    if (local_90 < 0xc) {
      local_94 = local_90;
    }
    else {
      local_94 = 0xb;
    }
    (s->params).quality = local_94;
    if ((s->params).quality < 3) {
      (s->params).large_window = 0;
    }
    if ((s->params).lgwin < 10) {
      (s->params).lgwin = 10;
    }
    else {
      iVar1 = 0x18;
      if ((s->params).large_window != 0) {
        iVar1 = 0x1e;
      }
      if (iVar1 < (s->params).lgwin) {
        (s->params).lgwin = iVar1;
      }
    }
    local_9c = (s->params).lgblock;
    if (((s->params).quality == 0) || ((s->params).quality == 1)) {
      local_54 = (s->params).lgwin;
    }
    else if ((s->params).quality < 4) {
      local_54 = 0xe;
    }
    else if (local_9c == 0) {
      local_54 = 0x10;
      if ((8 < (s->params).quality) && (0x10 < (s->params).lgwin)) {
        local_98 = (s->params).lgwin;
        if (0x12 < local_98) {
          local_98 = 0x12;
        }
        local_54 = local_98;
      }
    }
    else {
      if (local_9c < 0x10) {
        local_9c = 0x10;
      }
      if (local_9c < 0x19) {
        local_a0 = local_9c;
      }
      else {
        local_a0 = 0x18;
      }
      local_54 = local_a0;
    }
    (s->params).lgblock = local_54;
    ChooseDistanceParams(&s->params);
    s->remaining_metadata_bytes_ = 0xffffffff;
    iVar1 = (s->params).lgwin;
    local_a4 = (s->params).lgblock;
    if (local_a4 < iVar1) {
      local_a4 = iVar1;
    }
    bVar2 = (char)local_a4 + 1;
    iVar1 = (s->params).lgblock;
    (s->ringbuffer_).size_ = 1 << (bVar2 & 0x1f);
    (s->ringbuffer_).mask_ = (1 << (bVar2 & 0x1f)) - 1;
    (s->ringbuffer_).tail_size_ = 1 << ((byte)iVar1 & 0x1f);
    (s->ringbuffer_).total_size_ = (s->ringbuffer_).size_ + (s->ringbuffer_).tail_size_;
    local_a8 = (s->params).lgwin;
    if (((s->params).quality == 0) || (local_8c = local_a8, (s->params).quality == 1)) {
      if (local_a8 < 0x13) {
        local_a8 = 0x12;
      }
      local_8c = local_a8;
    }
    EncodeWindowBits(local_8c,(s->params).large_window,&s->last_bytes_,&s->last_bytes_bits_);
    if ((s->params).quality == 0) {
      InitCommandPrefixCodes(s->cmd_depths_,s->cmd_bits_,s->cmd_code_,&s->cmd_code_numbits_);
    }
    s->is_initialized_ = 1;
  }
  return 1;
}

Assistant:

static BROTLI_BOOL EnsureInitialized(BrotliEncoderState* s) {
  if (BROTLI_IS_OOM(&s->memory_manager_)) return BROTLI_FALSE;
  if (s->is_initialized_) return BROTLI_TRUE;

  SanitizeParams(&s->params);
  s->params.lgblock = ComputeLgBlock(&s->params);
  ChooseDistanceParams(&s->params);

  s->remaining_metadata_bytes_ = BROTLI_UINT32_MAX;

  RingBufferSetup(&s->params, &s->ringbuffer_);

  /* Initialize last byte with stream header. */
  {
    int lgwin = s->params.lgwin;
    if (s->params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY ||
        s->params.quality == FAST_TWO_PASS_COMPRESSION_QUALITY) {
      lgwin = BROTLI_MAX(int, lgwin, 18);
    }
    EncodeWindowBits(lgwin, s->params.large_window,
                     &s->last_bytes_, &s->last_bytes_bits_);
  }

  if (s->params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY) {
    InitCommandPrefixCodes(s->cmd_depths_, s->cmd_bits_,
                           s->cmd_code_, &s->cmd_code_numbits_);
  }

  s->is_initialized_ = BROTLI_TRUE;
  return BROTLI_TRUE;
}